

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O3

void ngram_search_save_bp(ngram_search_t *ngs,int frame_idx,int32 w,int32 score,int32 path,int32 rc)

{
  short sVar1;
  short sVar2;
  int iVar3;
  dictword_t *pdVar4;
  s3cipid_t *psVar5;
  bptbl_t *pbVar6;
  int32 *piVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  int iVar15;
  undefined8 uVar16;
  int iVar17;
  
  iVar3 = ngs->word_lat_idx[w];
  lVar12 = (long)iVar3;
  if (lVar12 != -1) {
    pbVar6 = ngs->bp_table;
    uVar11 = frame_idx - pbVar6[path].frame;
    if (2000 < (int)uVar11) {
      if (w < 0) {
        pcVar10 = (char *)0x0;
      }
      else {
        pcVar10 = ((ngs->base).dict)->word[w].word;
      }
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
              ,0x187,"Word \'%s\' survived for %d frames, potential overpruning\n",pcVar10,
              (ulong)uVar11);
      pbVar6 = ngs->bp_table;
    }
    if (pbVar6[lVar12].score < score) {
      if (iVar3 == path) {
        __assert_fail("path != bp",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                      ,0x18e,
                      "void ngram_search_save_bp(ngram_search_t *, int, int32, int32, int32, int32)"
                     );
      }
      iVar8 = pbVar6[lVar12].bp;
      lVar9 = (long)iVar8;
      if (iVar8 != path) {
        uVar13 = 0xffffffffffffffff;
        uVar16 = 0xffffffffffffffff;
        if (iVar8 != -1) {
          iVar8 = iVar8 * 9;
          uVar16._0_4_ = pbVar6[lVar9].real_wid;
          uVar16._4_4_ = pbVar6[lVar9].prev_real_wid;
        }
        if (path != -1) {
          uVar13._0_4_ = pbVar6[path].real_wid;
          uVar13._4_4_ = pbVar6[path].prev_real_wid;
        }
        iVar15 = -(uint)((int)uVar16 == (int)uVar13);
        iVar17 = -(uint)((int)((ulong)uVar16 >> 0x20) == (int)((ulong)uVar13 >> 0x20));
        auVar14._4_4_ = iVar15;
        auVar14._0_4_ = iVar15;
        auVar14._8_4_ = iVar17;
        auVar14._12_4_ = iVar17;
        iVar8 = movmskpd(iVar8,auVar14);
        if (iVar8 != 3) {
          set_real_wid(ngs,iVar3);
          pbVar6 = ngs->bp_table;
        }
        pbVar6[lVar12].bp = path;
      }
      pbVar6[lVar12].score = score;
    }
    if (pbVar6[lVar12].s_idx == -1) {
      return;
    }
    ngs->bscore_stack[pbVar6[lVar12].s_idx + rc] = score;
    return;
  }
  if (ngs->bpidx == -1) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
            ,0x1bc,"No entries in backpointer table!");
    return;
  }
  iVar3 = ngs->bp_table_size;
  if (iVar3 <= ngs->bpidx) {
    ngs->bp_table_size = iVar3 * 2;
    pbVar6 = (bptbl_t *)
             __ckd_realloc__(ngs->bp_table,(long)iVar3 * 0x48,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                             ,0x1c5);
    ngs->bp_table = pbVar6;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
            ,0x1c6,"Resized backpointer table to %d entries\n",(ulong)(uint)ngs->bp_table_size);
  }
  iVar3 = ngs->bscore_stack_size;
  if (iVar3 - ((ngs->base).acmod)->mdef->n_ciphone <= ngs->bss_head) {
    ngs->bscore_stack_size = iVar3 * 2;
    piVar7 = (int32 *)__ckd_realloc__(ngs->bscore_stack,(long)iVar3 << 3,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                      ,0x1cd);
    ngs->bscore_stack = piVar7;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
            ,0x1ce,"Resized score stack to %d entries\n",(ulong)(uint)ngs->bscore_stack_size);
  }
  iVar3 = ngs->bpidx;
  ngs->word_lat_idx[w] = iVar3;
  pbVar6 = ngs->bp_table;
  pbVar6[iVar3].wid = w;
  pbVar6[iVar3].frame = frame_idx;
  pbVar6[iVar3].bp = path;
  pbVar6[iVar3].score = score;
  pbVar6[iVar3].s_idx = ngs->bss_head;
  pbVar6[iVar3].valid = '\x01';
  if (iVar3 == path) {
    __assert_fail("path != ngs->bpidx",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                  ,0x1d9,
                  "void ngram_search_save_bp(ngram_search_t *, int, int32, int32, int32, int32)");
  }
  pdVar4 = ((ngs->base).dict)->word;
  psVar5 = pdVar4[w].ciphone;
  lVar12 = (long)pdVar4[w].pronlen;
  sVar1 = psVar5[lVar12 + -1];
  pbVar6[iVar3].last_phone = sVar1;
  if (lVar12 == 1) {
    pbVar6[iVar3].s_idx = -1;
    pbVar6[iVar3].last2_phone = -1;
LAB_001399e6:
    iVar8 = 0;
  }
  else {
    sVar2 = psVar5[lVar12 + -2];
    iVar8 = ((ngs->base).d2p)->rssid[sVar1][sVar2].n_ssid;
    pbVar6[iVar3].last2_phone = sVar2;
    if (iVar8 < 1) {
      if (iVar8 == 0) goto LAB_001399e6;
    }
    else {
      piVar7 = ngs->bscore_stack;
      lVar12 = 0;
      do {
        piVar7[ngs->bss_head + lVar12] = -0x20000000;
        lVar12 = lVar12 + 1;
      } while (iVar8 != (int)lVar12);
    }
    ngs->bscore_stack[(long)rc + (long)ngs->bss_head] = score;
  }
  set_real_wid(ngs,ngs->bpidx);
  ngs->bpidx = ngs->bpidx + 1;
  ngs->bss_head = ngs->bss_head + iVar8;
  return;
}

Assistant:

void
ngram_search_save_bp(ngram_search_t *ngs, int frame_idx,
                     int32 w, int32 score, int32 path, int32 rc)
{
    int32 bp;

    /* Look for an existing exit for this word in this frame.  The
     * only reason one would exist is from a different right context
     * triphone, but of course that happens quite frequently. */
    bp = ngs->word_lat_idx[w];
    if (bp != NO_BP) {

        if (frame_idx - ngs->bp_table[path].frame > NGRAM_HISTORY_LONG_WORD) {
    	    E_WARN("Word '%s' survived for %d frames, potential overpruning\n", dict_wordstr(ps_search_dict(ngs), w),
	    	    frame_idx - ngs->bp_table[path].frame);
	}

        /* Keep only the best scoring one, we will reconstruct the
         * others from the right context scores - usually the history
         * is not lost. */
        if (ngs->bp_table[bp].score WORSE_THAN score) {
            assert(path != bp); /* Pathological. */
            if (ngs->bp_table[bp].bp != path) {
                int32 bplh[2], newlh[2];
                /* But, sometimes, the history *is* lost.  If we wanted to
                 * do exact language model scoring we'd have to preserve
                 * these alternate histories. */
                E_DEBUG("Updating path history %d => %d frame %d\n",
                        ngs->bp_table[bp].bp, path, frame_idx);
                bplh[0] = ngs->bp_table[bp].bp == -1
                    ? -1 : ngs->bp_table[ngs->bp_table[bp].bp].prev_real_wid;
                bplh[1] = ngs->bp_table[bp].bp == -1
                    ? -1 : ngs->bp_table[ngs->bp_table[bp].bp].real_wid;
                newlh[0] = path == -1
                    ? -1 : ngs->bp_table[path].prev_real_wid;
                newlh[1] = path == -1
                    ? -1 : ngs->bp_table[path].real_wid;
                /* Actually it's worth checking how often the actual
                 * language model state changes. */
                if (bplh[0] != newlh[0] || bplh[1] != newlh[1]) {
                    /* It's fairly rare that the actual language model
                     * state changes, but it does happen some
                     * times. */
                    E_DEBUG("Updating language model state %s,%s => %s,%s frame %d\n",
                                dict_wordstr(ps_search_dict(ngs), bplh[0]),
                                dict_wordstr(ps_search_dict(ngs), bplh[1]),
                                dict_wordstr(ps_search_dict(ngs), newlh[0]),
                                dict_wordstr(ps_search_dict(ngs), newlh[1]),
                                frame_idx);
                    set_real_wid(ngs, bp);
                }
                ngs->bp_table[bp].bp = path;
            }
            ngs->bp_table[bp].score = score;
        }
        /* But do keep track of scores for all right contexts, since
         * we need them to determine the starting path scores for any
         * successors of this word exit. */
        if (ngs->bp_table[bp].s_idx != -1)
            ngs->bscore_stack[ngs->bp_table[bp].s_idx + rc] = score;
    }
    else {
        int32 i, rcsize;
        bptbl_t *be;

        /* This might happen if recognition fails. */
        if (ngs->bpidx == NO_BP) {
            E_ERROR("No entries in backpointer table!");
            return;
        }

        /* Expand the backpointer tables if necessary. */
        if (ngs->bpidx >= ngs->bp_table_size) {
            ngs->bp_table_size *= 2;
            ngs->bp_table = ckd_realloc(ngs->bp_table,
                                        ngs->bp_table_size
                                        * sizeof(*ngs->bp_table));
            E_INFO("Resized backpointer table to %d entries\n", ngs->bp_table_size);
        }
        if (ngs->bss_head >= ngs->bscore_stack_size
            - bin_mdef_n_ciphone(ps_search_acmod(ngs)->mdef)) {
            ngs->bscore_stack_size *= 2;
            ngs->bscore_stack = ckd_realloc(ngs->bscore_stack,
                                            ngs->bscore_stack_size
                                            * sizeof(*ngs->bscore_stack));
            E_INFO("Resized score stack to %d entries\n", ngs->bscore_stack_size);
        }

        ngs->word_lat_idx[w] = ngs->bpidx;
        be = &(ngs->bp_table[ngs->bpidx]);
        be->wid = w;
        be->frame = frame_idx;
        be->bp = path;
        be->score = score;
        be->s_idx = ngs->bss_head;
        be->valid = TRUE;
        assert(path != ngs->bpidx);

        /* DICT2PID */
        /* Get diphone ID for final phone and number of ssids corresponding to it. */
        be->last_phone = dict_last_phone(ps_search_dict(ngs),w);
        if (dict_is_single_phone(ps_search_dict(ngs), w)) {
            be->last2_phone = -1;
            be->s_idx = -1;
            rcsize = 0;
        }
        else {
            be->last2_phone = dict_second_last_phone(ps_search_dict(ngs),w);
            rcsize = dict2pid_rssid(ps_search_dict2pid(ngs),
                                    be->last_phone, be->last2_phone)->n_ssid;
        }
        /* Allocate some space on the bscore_stack for all of these triphones. */
        for (i = 0; i < rcsize; ++i)
            ngs->bscore_stack[ngs->bss_head + i] = WORST_SCORE;
        if (rcsize)
            ngs->bscore_stack[ngs->bss_head + rc] = score;
        set_real_wid(ngs, ngs->bpidx);

        ngs->bpidx++;
        ngs->bss_head += rcsize;
    }
}